

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool_extension.h
# Opt level: O2

void __thiscall dlib::thread_pool::thread_pool(thread_pool *this,unsigned_long num_threads)

{
  thread_pool_implementation *this_00;
  
  (this->impl).super___shared_ptr<dlib::thread_pool_implementation,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->impl).super___shared_ptr<dlib::thread_pool_implementation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (thread_pool_implementation *)operator_new(0x148);
  thread_pool_implementation::thread_pool_implementation(this_00,num_threads);
  std::__shared_ptr<dlib::thread_pool_implementation,_(__gnu_cxx::_Lock_policy)2>::
  reset<dlib::thread_pool_implementation>
            ((__shared_ptr<dlib::thread_pool_implementation,_(__gnu_cxx::_Lock_policy)2> *)this,
             this_00);
  return;
}

Assistant:

explicit thread_pool (
            unsigned long num_threads
        ) 
        {
            impl.reset(new thread_pool_implementation(num_threads));
        }